

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O2

ktx_error_code_e
compressedTexImage3DCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  GLenum GVar1;
  ktx_error_code_e kVar2;
  
  if (faceLodSize >> 0x20 == 0) {
    if (gl.glCompressedTexImage3D == (PFNGLCOMPRESSEDTEXIMAGE3DPROC)0x0) {
      __assert_fail("gl.glCompressedTexImage3D != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                    ,0x277,
                    "ktx_error_code_e compressedTexImage3DCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                   );
    }
    if (*(int *)((long)userdata + 0x14) != 0) {
      depth = *(int *)((long)userdata + 0x14);
    }
    (*gl.glCompressedTexImage3D)
              (face + *userdata,miplevel,*(GLenum *)((long)userdata + 8),width,height,depth,0,
               (GLsizei)faceLodSize,pixels);
    GVar1 = (*gl.glGetError)();
    *(GLenum *)((long)userdata + 0x10) = GVar1;
    kVar2 = (uint)(GVar1 != 0) * 9;
  }
  else {
    kVar2 = KTX_INVALID_OPERATION;
  }
  return kVar2;
}

Assistant:

KTX_error_code
compressedTexImage3DCallback(int miplevel, int face,
                             int width, int height,
                             int depth,
                             ktx_uint64_t faceLodSize,
                             void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;

    if (faceLodSize > UINT32_MAX)
        return KTX_INVALID_OPERATION; // Too big for OpenGL {,ES}.

    assert(gl.glCompressedTexImage3D != NULL);
    gl.glCompressedTexImage3D(cbData->glTarget + face, miplevel,
                             cbData->glInternalformat,
                             width, height,
                             cbData->numLayers == 0 ? (GLuint)depth : cbData->numLayers,
                             0,
                             (ktx_uint32_t)faceLodSize, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}